

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_code.cpp
# Opt level: O3

Am_Wrapper * pass_window_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *this;
  Am_Wrapper *pAVar2;
  Am_Object owner;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)self,10);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    Am_Object::Am_Object(&local_18,&Am_Graphical_Object);
    bVar1 = Am_Object::Is_Instance_Of(&local_20,&local_18);
    if (bVar1) {
      Am_Object::~Am_Object(&local_18);
    }
    else {
      Am_Object::Am_Object(&local_10,&Am_Window);
      bVar1 = Am_Object::Is_Instance_Of(&local_20,&local_10);
      Am_Object::~Am_Object(&local_10);
      Am_Object::~Am_Object(&local_18);
      if (!bVar1) goto LAB_001d81a5;
    }
    this = Am_Object::Get(&local_20,0x68,0);
    pAVar2 = Am_Value::operator_cast_to_Am_Wrapper_(this);
  }
  else {
LAB_001d81a5:
    pAVar2 = (Am_Wrapper *)0x0;
  }
  Am_Object::~Am_Object(&local_20);
  return pAVar2;
}

Assistant:

Am_Define_Object_Formula(pass_window)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid() && (owner.Is_Instance_Of(Am_Graphical_Object) ||
                        owner.Is_Instance_Of(Am_Window)))
    return owner.Get(Am_WINDOW);
  else
    return nullptr;
}